

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgtMan.c
# Opt level: O2

void Cgt_ManPrintStats(Cgt_Man_t *p)

{
  Cgt_Par_t *pCVar1;
  int level;
  
  pCVar1 = p->pPars;
  printf("Params: LevMax = %d. CandMax = %d. OdcMax = %d. ConfMax = %d. VarMin = %d. FlopMin = %d.\n"
         ,(ulong)(uint)pCVar1->nLevelMax,(ulong)(uint)pCVar1->nCandMax,(ulong)(uint)pCVar1->nOdcMax,
         (ulong)(uint)pCVar1->nConfMax,(ulong)(uint)pCVar1->nVarsMin,pCVar1->nFlopsMin);
  level = 0x7fd8a0;
  printf("SAT   : Calls = %d. Unsat = %d. Sat = %d. Fails = %d.  Recycles = %d.  ",
         (ulong)(uint)p->nCalls,(ulong)(uint)p->nCallsUnsat,(ulong)(uint)p->nCallsSat,
         (ulong)(uint)p->nCallsUndec,(ulong)(uint)p->nRecycles);
  Abc_Print(level,"%s =","Time");
  Abc_Print(level,"%9.2f sec\n",(double)p->timeTotal / 1000000.0);
  return;
}

Assistant:

void Cgt_ManPrintStats( Cgt_Man_t * p )
{
    printf( "Params: LevMax = %d. CandMax = %d. OdcMax = %d. ConfMax = %d. VarMin = %d. FlopMin = %d.\n", 
        p->pPars->nLevelMax, p->pPars->nCandMax, p->pPars->nOdcMax, 
        p->pPars->nConfMax, p->pPars->nVarsMin, p->pPars->nFlopsMin );
    printf( "SAT   : Calls = %d. Unsat = %d. Sat = %d. Fails = %d.  Recycles = %d.  ", 
        p->nCalls, p->nCallsUnsat, p->nCallsSat, p->nCallsUndec, p->nRecycles );
    ABC_PRT( "Time", p->timeTotal );
/*
    p->timeOther = p->timeTotal-p->timeAig-p->timePrepare-p->timeSat-p->timeDecision;
    ABC_PRTP( "AIG        ", p->timeAig,       p->timeTotal );
    ABC_PRTP( "Prepare    ", p->timePrepare,   p->timeTotal );
    ABC_PRTP( "SAT solving", p->timeSat,       p->timeTotal );
    ABC_PRTP( "  unsat    ", p->timeSatUnsat,  p->timeTotal );
    ABC_PRTP( "  sat      ", p->timeSatSat,    p->timeTotal );
    ABC_PRTP( "  undecided", p->timeSatUndec,  p->timeTotal );
    ABC_PRTP( "Other      ", p->timeOther,     p->timeTotal );
    ABC_PRTP( "TOTAL      ", p->timeTotal,     p->timeTotal );
*/
}